

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001a6880 = 0x2d2d2d2d2d2d2d;
    uRam00000000001a6887._0_1_ = '-';
    uRam00000000001a6887._1_1_ = '-';
    uRam00000000001a6887._2_1_ = '-';
    uRam00000000001a6887._3_1_ = '-';
    uRam00000000001a6887._4_1_ = '-';
    uRam00000000001a6887._5_1_ = '-';
    uRam00000000001a6887._6_1_ = '-';
    uRam00000000001a6887._7_1_ = '-';
    DAT_001a6870 = '-';
    DAT_001a6870_1._0_1_ = '-';
    DAT_001a6870_1._1_1_ = '-';
    DAT_001a6870_1._2_1_ = '-';
    DAT_001a6870_1._3_1_ = '-';
    DAT_001a6870_1._4_1_ = '-';
    DAT_001a6870_1._5_1_ = '-';
    DAT_001a6870_1._6_1_ = '-';
    uRam00000000001a6878 = 0x2d2d2d2d2d2d2d;
    DAT_001a687f = 0x2d;
    DAT_001a6860 = '-';
    DAT_001a6860_1._0_1_ = '-';
    DAT_001a6860_1._1_1_ = '-';
    DAT_001a6860_1._2_1_ = '-';
    DAT_001a6860_1._3_1_ = '-';
    DAT_001a6860_1._4_1_ = '-';
    DAT_001a6860_1._5_1_ = '-';
    DAT_001a6860_1._6_1_ = '-';
    uRam00000000001a6868._0_1_ = '-';
    uRam00000000001a6868._1_1_ = '-';
    uRam00000000001a6868._2_1_ = '-';
    uRam00000000001a6868._3_1_ = '-';
    uRam00000000001a6868._4_1_ = '-';
    uRam00000000001a6868._5_1_ = '-';
    uRam00000000001a6868._6_1_ = '-';
    uRam00000000001a6868._7_1_ = '-';
    DAT_001a6850 = '-';
    DAT_001a6850_1._0_1_ = '-';
    DAT_001a6850_1._1_1_ = '-';
    DAT_001a6850_1._2_1_ = '-';
    DAT_001a6850_1._3_1_ = '-';
    DAT_001a6850_1._4_1_ = '-';
    DAT_001a6850_1._5_1_ = '-';
    DAT_001a6850_1._6_1_ = '-';
    uRam00000000001a6858._0_1_ = '-';
    uRam00000000001a6858._1_1_ = '-';
    uRam00000000001a6858._2_1_ = '-';
    uRam00000000001a6858._3_1_ = '-';
    uRam00000000001a6858._4_1_ = '-';
    uRam00000000001a6858._5_1_ = '-';
    uRam00000000001a6858._6_1_ = '-';
    uRam00000000001a6858._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001a6848._0_1_ = '-';
    uRam00000000001a6848._1_1_ = '-';
    uRam00000000001a6848._2_1_ = '-';
    uRam00000000001a6848._3_1_ = '-';
    uRam00000000001a6848._4_1_ = '-';
    uRam00000000001a6848._5_1_ = '-';
    uRam00000000001a6848._6_1_ = '-';
    uRam00000000001a6848._7_1_ = '-';
    DAT_001a688f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}